

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_pool.c
# Opt level: O2

upb_FileDef *
upb_DefBuilder_AddFileToPool
          (upb_DefBuilder *builder,upb_DefPool *s,google_protobuf_FileDescriptorProto *file_proto,
          upb_StringView name,upb_Status *status)

{
  upb_FileDef *puVar1;
  _Bool _Var2;
  int iVar3;
  upb_deftype_t uVar4;
  upb_FieldDef *f;
  upb_ServiceDef *s_00;
  upb_FileDef *puVar5;
  upb_EnumValueDef *v;
  upb_EnumDef *e;
  upb_MessageDef *m;
  google_protobuf_FeatureSet *pgVar6;
  upb_value local_58;
  upb_DefBuilder *local_50;
  intptr_t iter;
  upb_StringView key;
  
  iVar3 = _setjmp((__jmp_buf_tag *)builder->err);
  if (iVar3 != 0) {
    _Var2 = upb_Status_IsOk(status);
    if (_Var2) {
      __assert_fail("!upb_Status_IsOk(status)",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/reflection/def_pool.c"
                    ,0x15e,
                    "const upb_FileDef *upb_DefBuilder_AddFileToPool(upb_DefBuilder *const, upb_DefPool *const, const google_protobuf_FileDescriptorProto *const, const upb_StringView, upb_Status *const)"
                   );
    }
    puVar1 = builder->file;
    if (puVar1 != (upb_FileDef *)0x0) {
      iter = -1;
      local_50 = builder;
      while (_Var2 = upb_strtable_next2(&s->syms,&key,&local_58,&iter), _Var2) {
        uVar4 = _upb_DefType_Type(local_58);
        switch(uVar4) {
        case UPB_DEFTYPE_EXT:
          f = (upb_FieldDef *)_upb_DefType_Unpack(local_58,UPB_DEFTYPE_EXT);
          puVar5 = upb_FieldDef_File(f);
          break;
        case UPB_DEFTYPE_MSG:
          m = (upb_MessageDef *)_upb_DefType_Unpack(local_58,UPB_DEFTYPE_MSG);
          puVar5 = upb_MessageDef_File(m);
          break;
        case UPB_DEFTYPE_ENUM:
          e = (upb_EnumDef *)_upb_DefType_Unpack(local_58,UPB_DEFTYPE_ENUM);
          goto LAB_001188cd;
        case UPB_DEFTYPE_ENUMVAL:
          v = (upb_EnumValueDef *)_upb_DefType_Unpack(local_58,UPB_DEFTYPE_ENUMVAL);
          e = upb_EnumValueDef_Enum(v);
LAB_001188cd:
          puVar5 = upb_EnumDef_File(e);
          break;
        case UPB_DEFTYPE_SERVICE:
          s_00 = (upb_ServiceDef *)_upb_DefType_Unpack(local_58,UPB_DEFTYPE_SERVICE);
          puVar5 = upb_ServiceDef_File(s_00);
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/reflection/def_pool.c"
                        ,0x152,"void remove_filedef(upb_DefPool *, upb_FileDef *)");
        }
        if (puVar5 == puVar1) {
          upb_strtable_removeiter(&s->syms,&iter);
        }
      }
      local_50->file = (upb_FileDef *)0x0;
      builder = local_50;
    }
LAB_0011899a:
    if (builder->arena != (upb_Arena *)0x0) {
      upb_Arena_Free(builder->arena);
    }
    if (builder->tmp_arena != (upb_Arena *)0x0) {
      upb_Arena_Free(builder->tmp_arena);
    }
    return builder->file;
  }
  if (((builder->arena != (upb_Arena *)0x0) && (builder->tmp_arena != (upb_Arena *)0x0)) &&
     (_Var2 = upb_strtable_init(&builder->feature_cache,0x10,builder->tmp_arena), _Var2)) {
    pgVar6 = (google_protobuf_FeatureSet *)
             _upb_Message_New(&google__protobuf__FeatureSet_msg_init,builder->tmp_arena);
    builder->legacy_features = pgVar6;
    if (pgVar6 != (google_protobuf_FeatureSet *)0x0) {
      _upb_FileDef_Create(builder,file_proto);
      upb_strtable_insert(&s->files,name.data,name.size,(upb_value)builder->file,builder->arena);
      _Var2 = upb_Status_IsOk(status);
      if (!_Var2) {
        __assert_fail("upb_Status_IsOk(status)",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/upb/reflection/def_pool.c"
                      ,0x16d,
                      "const upb_FileDef *upb_DefBuilder_AddFileToPool(upb_DefBuilder *const, upb_DefPool *const, const google_protobuf_FileDescriptorProto *const, const upb_StringView, upb_Status *const)"
                     );
      }
      upb_Arena_Fuse(s->arena,builder->arena);
      goto LAB_0011899a;
    }
  }
  _upb_DefBuilder_OomErr(builder);
}

Assistant:

static const upb_FileDef* upb_DefBuilder_AddFileToPool(
    upb_DefBuilder* const builder, upb_DefPool* const s,
    const UPB_DESC(FileDescriptorProto) * const file_proto,
    const upb_StringView name, upb_Status* const status) {
  if (UPB_SETJMP(builder->err) != 0) {
    UPB_ASSERT(!upb_Status_IsOk(status));
    if (builder->file) {
      remove_filedef(s, builder->file);
      builder->file = NULL;
    }
  } else if (!builder->arena || !builder->tmp_arena ||
             !upb_strtable_init(&builder->feature_cache, 16,
                                builder->tmp_arena) ||
             !(builder->legacy_features =
                   UPB_DESC(FeatureSet_new)(builder->tmp_arena))) {
    _upb_DefBuilder_OomErr(builder);
  } else {
    _upb_FileDef_Create(builder, file_proto);
    upb_strtable_insert(&s->files, name.data, name.size,
                        upb_value_constptr(builder->file), builder->arena);
    UPB_ASSERT(upb_Status_IsOk(status));
    upb_Arena_Fuse(s->arena, builder->arena);
  }

  if (builder->arena) upb_Arena_Free(builder->arena);
  if (builder->tmp_arena) upb_Arena_Free(builder->tmp_arena);
  return builder->file;
}